

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

Node * __thiscall asmjit::ConstPool::Tree::get(Tree *this,void *data)

{
  size_t __n;
  int iVar1;
  void *in_RSI;
  undefined8 *in_RDI;
  int c;
  size_t dataSize;
  Node *node;
  Node *local_28;
  
  local_28 = (Node *)*in_RDI;
  __n = in_RDI[2];
  while( true ) {
    if (local_28 == (Node *)0x0) {
      return (Node *)0x0;
    }
    iVar1 = memcmp(local_28 + 1,in_RSI,__n);
    if (iVar1 == 0) break;
    local_28 = local_28->_link[iVar1 < 0];
  }
  return local_28;
}

Assistant:

ConstPool::Node* ConstPool::Tree::get(const void* data) noexcept {
  ConstPool::Node* node = _root;
  size_t dataSize = _dataSize;

  while (node) {
    int c = ::memcmp(node->getData(), data, dataSize);
    if (c == 0)
      return node;
    node = node->_link[c < 0];
  }

  return nullptr;
}